

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O2

string * __thiscall
deqp::gls::ShaderExecUtil::generateVertexShaderForTess_abi_cxx11_
          (string *__return_storage_ptr__,ShaderExecUtil *this,GLSLVersion version)

{
  char *pcVar1;
  ostream *poVar2;
  ostringstream src;
  ostringstream aoStack_188 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_188);
  pcVar1 = glu::getGLSLVersionDeclaration((GLSLVersion)this);
  poVar2 = std::operator<<((ostream *)aoStack_188,pcVar1);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)aoStack_188,"void main (void)\n{\n");
  poVar2 = std::operator<<(poVar2,"\tgl_Position = vec4(gl_VertexID/2, gl_VertexID%2, 0.0, 1.0);\n")
  ;
  std::operator<<(poVar2,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_188);
  return __return_storage_ptr__;
}

Assistant:

static std::string generateVertexShaderForTess (glu::GLSLVersion version)
{
	std::ostringstream	src;

	src << glu::getGLSLVersionDeclaration(version) << "\n";

	src << "void main (void)\n{\n"
		<< "	gl_Position = vec4(gl_VertexID/2, gl_VertexID%2, 0.0, 1.0);\n"
		<< "}\n";

	return src.str();
}